

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::Pop(SQVM *this,SQInteger n)

{
  SQObjectPtr *this_00;
  SQUnsignedInteger pos;
  long local_20;
  SQInteger i;
  SQInteger n_local;
  SQVM *this_local;
  
  for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
    pos = this->_top - 1;
    this->_top = pos;
    this_00 = sqvector<SQObjectPtr>::operator[](&this->_stack,pos);
    ::SQObjectPtr::Null(this_00);
  }
  return;
}

Assistant:

void SQVM::Pop(SQInteger n) {
    for(SQInteger i = 0; i < n; i++){
        _stack[--_top].Null();
    }
}